

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O0

void __thiscall UKF::ProcessMeasurement(UKF *this,MeasurementPackage *meas_package)

{
  DenseIndex *pDVar1;
  MeasurementPackage local_1a8;
  ConstantReturnType local_188;
  undefined1 local_170 [8];
  MatrixXd Tc_1;
  undefined1 local_140 [8];
  MatrixXd S_1;
  undefined1 local_110 [8];
  VectorXd z_pred_1;
  ConstantReturnType local_e0;
  undefined1 local_c8 [8];
  MatrixXd Tc;
  undefined1 local_98 [8];
  MatrixXd S;
  undefined1 local_68 [8];
  VectorXd z_pred;
  double dt;
  double delta_t;
  MeasurementPackage local_38;
  MeasurementPackage *local_18;
  MeasurementPackage *meas_package_local;
  UKF *this_local;
  
  local_18 = meas_package;
  meas_package_local = (MeasurementPackage *)this;
  if ((this->is_initialized_ & 1U) == 0) {
    MeasurementPackage::MeasurementPackage(&local_38,meas_package);
    SetInitialValues(this,&local_38);
    MeasurementPackage::~MeasurementPackage(&local_38);
    this->previous_timestamp_ = meas_package->timestamp_;
    this->is_initialized_ = true;
  }
  else {
    for (dt = (double)(meas_package->timestamp_ - this->previous_timestamp_) / 1000000.0; 0.1 < dt;
        dt = dt - 0.05) {
      z_pred.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           0x3fa999999999999a;
      Prediction(this,0.05);
    }
    Prediction(this,dt);
    if ((meas_package->sensor_type_ == RADAR) && ((this->use_radar_ & 1U) != 0)) {
      pDVar1 = &S.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
                ((ConstantReturnType *)pDVar1,(long)this->n_zrad_);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((Matrix<double,_1,1,0,_1,1> *)local_68,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)pDVar1);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                ((ConstantReturnType *)
                 &Tc.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,(long)this->n_zrad_,(long)this->n_zrad_);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_98,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&Tc.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                (&local_e0,(long)this->n_x_,(long)this->n_zrad_);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_c8,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_e0);
      PredictRadarMeasurement(this,(VectorXd *)local_68,(MatrixXd *)local_98,(MatrixXd *)local_c8);
      MeasurementPackage::MeasurementPackage
                ((MeasurementPackage *)
                 &z_pred_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,meas_package);
      UpdateRadar(this,(MeasurementPackage *)
                       &z_pred_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows,(VectorXd *)local_68,(MatrixXd *)local_c8,
                  (MatrixXd *)local_98);
      MeasurementPackage::~MeasurementPackage
                ((MeasurementPackage *)
                 &z_pred_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows);
      this->previous_timestamp_ = meas_package->timestamp_;
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_c8);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_98);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_68);
    }
    else if ((meas_package->sensor_type_ == LASER) && ((this->use_laser_ & 1U) != 0)) {
      pDVar1 = &S_1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
                ((ConstantReturnType *)pDVar1,(long)this->n_zlas_);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((Matrix<double,_1,1,0,_1,1> *)local_110,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)pDVar1);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                ((ConstantReturnType *)
                 &Tc_1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,(long)this->n_zlas_,(long)this->n_zlas_);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_140,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&Tc_1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                     .m_cols);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                (&local_188,(long)this->n_x_,(long)this->n_zlas_);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,_1,_1,0,_1,_1> *)local_170,
                 (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_188);
      PredictLidarMeasurement
                (this,(VectorXd *)local_110,(MatrixXd *)local_140,(MatrixXd *)local_170);
      MeasurementPackage::MeasurementPackage(&local_1a8,meas_package);
      UpdateLidar(this,&local_1a8,(VectorXd *)local_110,(MatrixXd *)local_170,(MatrixXd *)local_140)
      ;
      MeasurementPackage::~MeasurementPackage(&local_1a8);
      this->previous_timestamp_ = meas_package->timestamp_;
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_170);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_140);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_110);
    }
  }
  return;
}

Assistant:

void UKF::ProcessMeasurement(const MeasurementPackage meas_package) {
  
  if (!is_initialized_) {

    //  Initialize the state x_,state covariance matrix P_
    SetInitialValues(meas_package);
    previous_timestamp_ = meas_package.timestamp_;
    is_initialized_ = true;

    return;
  }


  double delta_t =  (meas_package.timestamp_ - previous_timestamp_) / 1000000.0;
  while (delta_t > 0.1)
  {
//  cout<< "delta_t: " << delta_t << endl;
//  cout << "Press ENTER to continue...";
//  cin.ignore( std::numeric_limits<std::streamsize>::max(), '\n' );
  
  const double dt = 0.05;
  Prediction(dt);
  delta_t -= dt;
  }

  Prediction(delta_t);


  if ( meas_package.sensor_type_ == MeasurementPackage::RADAR && use_radar_ ) {
    // Radar updates 
    // rho, phi, rho_dot

    //mean predicted measurement
    VectorXd z_pred = VectorXd::Zero(n_zrad_);
    //measurement covariance matrix S
    MatrixXd S = MatrixXd::Zero(n_zrad_,n_zrad_);
    // cross-correlation matrix Tc
    MatrixXd Tc = MatrixXd::Zero(n_x_, n_zrad_);
    // get predictions for x,S and Tc in RADAR space
    PredictRadarMeasurement(z_pred, S, Tc);  
    // update the state using the RADAR measurement
    UpdateRadar(meas_package, z_pred, Tc, S);
    // update the time
    previous_timestamp_ = meas_package.timestamp_;

  } 

  else if ( meas_package.sensor_type_ == MeasurementPackage::LASER && use_laser_ ) {
    // Laser updates
    // px, py

    //mean predicted measurement
    VectorXd z_pred = VectorXd::Zero(n_zlas_);
    //measurement covariance matrix S
    MatrixXd S = MatrixXd::Zero(n_zlas_,n_zlas_);
    // cross-correlation matrix Tc
    MatrixXd Tc = MatrixXd::Zero(n_x_, n_zlas_);
    // get predictions for x,S and Tc in Lidar space
    PredictLidarMeasurement(z_pred, S, Tc);
    // update the state using the LIDAR measurement
    UpdateLidar(meas_package, z_pred, Tc, S);
    // update the time
    previous_timestamp_ = meas_package.timestamp_;

  }

  return;

}